

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ypipe.hpp
# Opt level: O0

ssize_t __thiscall
zmq::ypipe_t<zmq::command_t,_16>::read
          (ypipe_t<zmq::command_t,_16> *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  undefined7 extraout_var;
  command_t *__src;
  undefined7 extraout_var_00;
  undefined7 uVar2;
  undefined4 in_register_00000034;
  ypipe_t<zmq::command_t,_16> *this_00;
  ypipe_t<zmq::command_t,_16> *this_01;
  
  this_00 = (ypipe_t<zmq::command_t,_16> *)CONCAT44(in_register_00000034,__fd);
  this_01 = this;
  bVar1 = check_read(this_00);
  uVar2 = extraout_var;
  if (bVar1) {
    __src = yqueue_t<zmq::command_t,_16>::front(&this->_queue);
    memcpy(this_00,__src,0x40);
    yqueue_t<zmq::command_t,_16>::pop((yqueue_t<zmq::command_t,_16> *)this_01);
    uVar2 = extraout_var_00;
  }
  return CONCAT71(uVar2,bVar1);
}

Assistant:

bool read (T *value_)
    {
        //  Try to prefetch a value.
        if (!check_read ())
            return false;

        //  There was at least one value prefetched.
        //  Return it to the caller.
        *value_ = _queue.front ();
        _queue.pop ();
        return true;
    }